

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  bool bVar1;
  anon_union_8_4_dbbb708a_for_data aVar2;
  undefined1 uVar3;
  int iVar4;
  char *pcVar5;
  char *input;
  long lVar6;
  size_t sVar7;
  __va_list_tag *p_Var8;
  bool bVar9;
  void *local_1680;
  double local_1660;
  double val;
  size_t maxprec;
  size_t sStack_1648;
  int len_1;
  size_t left;
  char *fptr;
  char formatbuf [32];
  char *point;
  void *ptr;
  size_t len;
  char *str;
  char *w;
  longlong signed_num;
  unsigned_long_long num;
  unsigned_long base;
  void *pvStack_15d0;
  int is_neg;
  long prec;
  long width;
  int is_alt;
  char *workend;
  va_stack_t *p;
  char work [326];
  char **end;
  char *endpos [128];
  va_stack_t vto [128];
  long param_num;
  long param;
  __va_list_tag *p_Stack_40;
  int done;
  char *f;
  char *digits;
  __va_list_tag *ap_save_local;
  char *format_local;
  _func_int_int_FILE_ptr *stream_local;
  void *data_local;
  
  f = "0123456789abcdefghijklmnopqrstuvwxyz";
  param._4_4_ = 0;
  vto[0x7f].data.str = (char *)0x0;
  pcVar5 = work + 0x13c;
  digits = (char *)ap_save;
  ap_save_local = (__va_list_tag *)format;
  format_local = (char *)stream;
  stream_local = (_func_int_int_FILE_ptr *)data;
  iVar4 = dprintf_Pass1(format,(va_stack_t *)(endpos + 0x7f),(char **)&end,ap_save);
  if (iVar4 == 0) {
    p_Stack_40 = ap_save_local;
    unique0x10001cc3 = &end;
    while ((char)p_Stack_40->gp_offset != '\0') {
      if ((char)p_Stack_40->gp_offset == '%') {
        input = (char *)((long)&p_Stack_40->gp_offset + 1);
        if (*input == '%') {
          p_Stack_40 = (__va_list_tag *)((long)&p_Stack_40->gp_offset + 2);
          iVar4 = (*(code *)format_local)(0x25,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
        }
        else {
          p_Stack_40 = (__va_list_tag *)input;
          lVar6 = dprintf_DollarString(input,(char **)&stack0xffffffffffffffc0);
          aVar2 = vto[0x7f].data;
          if (lVar6 == 0) {
            param_num = (long)vto[0x7f].data;
          }
          else {
            param_num = lVar6 + -1;
          }
          vto[0x7f].data.str = vto[0x7f].data.str + 1;
          if (((ulong)vto[param_num + -1].data.str & 0x400000000000) == 0) {
            prec._0_4_ = vto[param_num].type;
            prec._4_4_ = vto[param_num].flags;
          }
          else {
            prec = vto[*(long *)(vto + param_num)].precision;
            vto[0x7f].data.str = aVar2.str + 2;
            if (prec < 0) {
              prec = -prec;
              *(uint *)((long)&vto[param_num + -1].data + 4) =
                   *(uint *)((long)&vto[param_num + -1].data + 4) | 4;
              *(uint *)((long)&vto[param_num + -1].data + 4) =
                   *(uint *)((long)&vto[param_num + -1].data + 4) & 0xfffffeff;
            }
          }
          if (((ulong)vto[param_num + -1].data.str & 0x1000000000000) == 0) {
            if (((ulong)vto[param_num + -1].data.str & 0x800000000000) == 0) {
              pvStack_15d0 = (void *)0xffffffffffffffff;
            }
            else {
              pvStack_15d0 = (void *)vto[param_num].width;
            }
          }
          else {
            pvStack_15d0 = (void *)vto[vto[param_num].width].precision;
            vto[0x7f].data.str = vto[0x7f].data.str + 1;
            if ((long)pvStack_15d0 < 0) {
              pvStack_15d0 = (void *)0xffffffffffffffff;
            }
          }
          width._4_4_ = (*(uint *)((long)&vto[param_num + -1].data + 4) & 8) >> 3;
          switch(*(undefined4 *)&vto[param_num + -1].data) {
          case 1:
            len = vto[param_num].precision;
            if ((char *)len == (char *)0x0) {
              if ((pvStack_15d0 == (void *)0xffffffffffffffff) || (4 < (long)pvStack_15d0)) {
                len = (size_t)dprintf_formatf::null;
                ptr = (void *)0x5;
                *(uint *)((long)&vto[param_num + -1].data + 4) =
                     *(uint *)((long)&vto[param_num + -1].data + 4) & 0xfffffff7;
              }
              else {
                len = (long)"%ld\n" + 4;
                ptr = (void *)0x0;
              }
            }
            else if (pvStack_15d0 == (void *)0xffffffffffffffff) {
              ptr = (void *)strlen((char *)len);
            }
            else {
              ptr = pvStack_15d0;
            }
            if (ptr < (void *)0x8000000000000000) {
              local_1680 = ptr;
            }
            else {
              local_1680 = (void *)0x7fffffffffffffff;
            }
            prec = prec - (long)local_1680;
            if (((ulong)vto[param_num + -1].data.str & 0x800000000) != 0) {
              iVar4 = (*(code *)format_local)(0x22,stream_local);
              if (iVar4 == -1) {
                return param._4_4_;
              }
              param._4_4_ = param._4_4_ + 1;
            }
            if (((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) {
              while (lVar6 = prec + -1, bVar9 = 0 < prec, prec = lVar6, bVar9) {
                iVar4 = (*(code *)format_local)(0x20,stream_local);
                if (iVar4 == -1) {
                  return param._4_4_;
                }
                param._4_4_ = param._4_4_ + 1;
              }
            }
            while( true ) {
              bVar9 = false;
              if (ptr != (void *)0x0) {
                bVar9 = *(char *)len != '\0';
              }
              if (!bVar9) break;
              iVar4 = (*(code *)format_local)(*(undefined1 *)len,stream_local);
              if (iVar4 == -1) {
                return param._4_4_;
              }
              param._4_4_ = param._4_4_ + 1;
              ptr = (void *)((long)ptr + -1);
              len = len + 1;
            }
            if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
              while (0 < prec) {
                iVar4 = (*(code *)format_local)(0x20,stream_local);
                if (iVar4 == -1) {
                  return param._4_4_;
                }
                param._4_4_ = param._4_4_ + 1;
                prec = prec + -1;
              }
            }
            if (((ulong)vto[param_num + -1].data.str & 0x800000000) != 0) {
              iVar4 = (*(code *)format_local)(0x22,stream_local);
              if (iVar4 == -1) {
                return param._4_4_;
              }
              param._4_4_ = param._4_4_ + 1;
            }
            break;
          case 2:
            signed_num = vto[param_num].precision;
            if (signed_num == 0) {
              prec = prec + -5;
              if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
                while (lVar6 = prec + -1, bVar9 = 0 < prec, prec = lVar6, bVar9) {
                  iVar4 = (*(code *)format_local)(0x20,stream_local);
                  if (iVar4 == -1) {
                    return param._4_4_;
                  }
                  param._4_4_ = param._4_4_ + 1;
                }
              }
              for (formatbuf._24_8_ = dprintf_formatf::strnil; *(char *)formatbuf._24_8_ != '\0';
                  formatbuf._24_8_ = formatbuf._24_8_ + 1) {
                iVar4 = (*(code *)format_local)(*(undefined1 *)formatbuf._24_8_,stream_local);
                if (iVar4 == -1) {
                  return param._4_4_;
                }
                param._4_4_ = param._4_4_ + 1;
              }
              if (((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) {
                while (0 < prec) {
                  iVar4 = (*(code *)format_local)(0x20,stream_local);
                  if (iVar4 == -1) {
                    return param._4_4_;
                  }
                  param._4_4_ = param._4_4_ + 1;
                  prec = prec + -1;
                }
              }
            }
            else {
              num = 0x10;
              f = "0123456789abcdefghijklmnopqrstuvwxyz";
              if (((ulong)vto[param_num + -1].data.str & 0x100000000000) != 0) {
                f = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
              }
              width._4_4_ = 1;
              bVar9 = false;
LAB_001028b1:
              str = pcVar5;
              if (pvStack_15d0 == (void *)0xffffffffffffffff) {
                pvStack_15d0 = (void *)0x1;
              }
              for (; signed_num != 0; signed_num = (ulong)signed_num / num) {
                *str = f[(ulong)signed_num % num];
                str = str + -1;
              }
              prec = prec - ((long)pcVar5 - (long)str);
              pvStack_15d0 = (void *)((long)pvStack_15d0 - ((long)pcVar5 - (long)str));
              if (((width._4_4_ != 0) && (num == 8)) && ((long)pvStack_15d0 < 1)) {
                *str = '0';
                prec = prec + -1;
                str = str + -1;
              }
              if (0 < (long)pvStack_15d0) {
                prec = prec - (long)pvStack_15d0;
                while (0 < (long)pvStack_15d0) {
                  *str = '0';
                  str = str + -1;
                  pvStack_15d0 = (void *)((long)pvStack_15d0 + -1);
                }
              }
              if ((width._4_4_ != 0) && (num == 0x10)) {
                prec = prec + -2;
              }
              if (((bVar9) || (((ulong)vto[param_num + -1].data.str & 0x200000000) != 0)) ||
                 (((ulong)vto[param_num + -1].data.str & 0x100000000) != 0)) {
                prec = prec + -1;
              }
              if ((((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) &&
                 (((ulong)vto[param_num + -1].data.str & 0x10000000000) == 0)) {
                while (lVar6 = prec + -1, bVar1 = 0 < prec, prec = lVar6, bVar1) {
                  iVar4 = (*(code *)format_local)(0x20,stream_local);
                  if (iVar4 == -1) {
                    return param._4_4_;
                  }
                  param._4_4_ = param._4_4_ + 1;
                }
              }
              if (bVar9) {
                iVar4 = (*(code *)format_local)(0x2d,stream_local);
                if (iVar4 == -1) {
                  return param._4_4_;
                }
                param._4_4_ = param._4_4_ + 1;
              }
              else if (((ulong)vto[param_num + -1].data.str & 0x200000000) == 0) {
                if (((ulong)vto[param_num + -1].data.str & 0x100000000) != 0) {
                  iVar4 = (*(code *)format_local)(0x20,stream_local);
                  if (iVar4 == -1) {
                    return param._4_4_;
                  }
                  param._4_4_ = param._4_4_ + 1;
                }
              }
              else {
                iVar4 = (*(code *)format_local)(0x2b,stream_local);
                if (iVar4 == -1) {
                  return param._4_4_;
                }
                param._4_4_ = param._4_4_ + 1;
              }
              if ((width._4_4_ != 0) && (num == 0x10)) {
                iVar4 = (*(code *)format_local)(0x30,stream_local);
                if (iVar4 == -1) {
                  return param._4_4_;
                }
                if (((ulong)vto[param_num + -1].data.str & 0x100000000000) == 0) {
                  iVar4 = (*(code *)format_local)(0x78,stream_local);
                }
                else {
                  iVar4 = (*(code *)format_local)(0x58,stream_local);
                }
                if (iVar4 == -1) {
                  return param._4_4_ + 1;
                }
                param._4_4_ = param._4_4_ + 2;
              }
              if ((((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) &&
                 (((ulong)vto[param_num + -1].data.str & 0x10000000000) != 0)) {
                while (lVar6 = prec + -1, bVar9 = 0 < prec, prec = lVar6, bVar9) {
                  iVar4 = (*(code *)format_local)(0x30,stream_local);
                  if (iVar4 == -1) {
                    return param._4_4_;
                  }
                  param._4_4_ = param._4_4_ + 1;
                }
              }
              while (str = str + 1, str <= pcVar5) {
                iVar4 = (*(code *)format_local)(*str,stream_local);
                if (iVar4 == -1) {
                  return param._4_4_;
                }
                param._4_4_ = param._4_4_ + 1;
              }
              if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
                while (0 < prec) {
                  iVar4 = (*(code *)format_local)(0x20,stream_local);
                  if (iVar4 == -1) {
                    return param._4_4_;
                  }
                  param._4_4_ = param._4_4_ + 1;
                  prec = prec + -1;
                }
              }
            }
            break;
          case 3:
            signed_num = vto[param_num].precision;
            if (((ulong)vto[param_num + -1].data.str & 0x2000000000000) == 0) {
              if (((ulong)vto[param_num + -1].data.str & 0x40000000000) == 0) {
                if (((ulong)vto[param_num + -1].data.str & 0x80000000000) == 0) {
                  if (((ulong)vto[param_num + -1].data.str & 0x20000000000) == 0) {
                    num = 10;
                    bVar9 = vto[param_num].precision < 0;
                    if (bVar9) {
                      signed_num = 1 - (vto[param_num].precision + 1);
                    }
                    goto LAB_001028b1;
                  }
                  num = 10;
                }
                else {
                  f = "0123456789abcdefghijklmnopqrstuvwxyz";
                  if (((ulong)vto[param_num + -1].data.str & 0x100000000000) != 0) {
                    f = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
                  }
                  num = 0x10;
                }
              }
              else {
                num = 8;
              }
              bVar9 = false;
              goto LAB_001028b1;
            }
            if (((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) {
              while (prec = prec + -1, 0 < prec) {
                iVar4 = (*(code *)format_local)(0x20,stream_local);
                if (iVar4 == -1) {
                  return param._4_4_;
                }
                param._4_4_ = param._4_4_ + 1;
              }
            }
            iVar4 = (*(code *)format_local)(signed_num & 0xff,stream_local);
            if (iVar4 == -1) {
              return param._4_4_;
            }
            param._4_4_ = param._4_4_ + 1;
            if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
              while (prec = prec + -1, 0 < prec) {
                iVar4 = (*(code *)format_local)(0x20,stream_local);
                if (iVar4 == -1) {
                  return param._4_4_;
                }
                param._4_4_ = param._4_4_ + 1;
              }
            }
            break;
          case 4:
            if (((ulong)vto[param_num + -1].data.str & 0x4000000000) == 0) {
              if (((ulong)vto[param_num + -1].data.str & 0x2000000000) == 0) {
                if (((ulong)vto[param_num + -1].data.str & 0x1000000000) == 0) {
                  *(int *)vto[param_num].precision = param._4_4_;
                }
                else {
                  *(short *)vto[param_num].precision = (short)param._4_4_;
                }
              }
              else {
                *(long *)vto[param_num].precision = (long)param._4_4_;
              }
            }
            else {
              *(long *)vto[param_num].precision = (long)param._4_4_;
            }
            break;
          default:
            break;
          case 7:
            fptr = (char *)0x25;
            formatbuf[0] = '\0';
            formatbuf[1] = '\0';
            formatbuf[2] = '\0';
            formatbuf[3] = '\0';
            formatbuf[4] = '\0';
            formatbuf[5] = '\0';
            formatbuf[6] = '\0';
            formatbuf[7] = '\0';
            formatbuf[8] = '\0';
            formatbuf[9] = '\0';
            formatbuf[10] = '\0';
            formatbuf[0xb] = '\0';
            formatbuf[0xc] = '\0';
            formatbuf[0xd] = '\0';
            formatbuf[0xe] = '\0';
            formatbuf[0xf] = '\0';
            formatbuf[0x10] = '\0';
            formatbuf[0x11] = '\0';
            formatbuf[0x12] = '\0';
            formatbuf[0x13] = '\0';
            formatbuf[0x14] = '\0';
            formatbuf[0x15] = '\0';
            formatbuf[0x16] = '\0';
            formatbuf[0x17] = '\0';
            left = (long)&fptr + 1;
            sVar7 = strlen((char *)&fptr);
            sStack_1648 = 0x20 - sVar7;
            prec = -1;
            if (((ulong)vto[param_num + -1].data.str & 0x200000000000) == 0) {
              if (((ulong)vto[param_num + -1].data.str & 0x400000000000) != 0) {
                prec = vto[*(long *)(vto + param_num)].precision;
              }
            }
            else {
              prec._0_4_ = vto[param_num].type;
              prec._4_4_ = vto[param_num].flags;
            }
            pvStack_15d0 = (void *)0xffffffffffffffff;
            if (((ulong)vto[param_num + -1].data.str & 0x800000000000) == 0) {
              if (((ulong)vto[param_num + -1].data.str & 0x1000000000000) != 0) {
                pvStack_15d0 = (void *)vto[vto[param_num].width].precision;
              }
            }
            else {
              pvStack_15d0 = (void *)vto[param_num].width;
            }
            if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
              left = (long)&fptr + 2;
              fptr._1_1_ = 0x2d;
            }
            if (((ulong)vto[param_num + -1].data.str & 0x200000000) != 0) {
              *(undefined1 *)left = 0x2b;
              left = left + 1;
            }
            if (((ulong)vto[param_num + -1].data.str & 0x100000000) != 0) {
              *(undefined1 *)left = 0x20;
              left = left + 1;
            }
            if (((ulong)vto[param_num + -1].data.str & 0x800000000) != 0) {
              *(undefined1 *)left = 0x23;
              left = left + 1;
            }
            *(undefined1 *)left = 0;
            if (-1 < prec) {
              if (0x145 < prec) {
                prec = 0x145;
              }
              iVar4 = curl_msnprintf((char *)left,sStack_1648,"%ld",prec);
              left = left + (long)iVar4;
              sStack_1648 = sStack_1648 - (long)iVar4;
            }
            if (-1 < (long)pvStack_15d0) {
              val = 1.60077269252564e-321;
              for (local_1660 = (double)vto[param_num].precision; 10.0 <= local_1660;
                  local_1660 = local_1660 / 10.0) {
                val = (double)((long)val + -1);
              }
              if ((long)val < (long)pvStack_15d0) {
                pvStack_15d0 = (void *)((long)val + -1);
              }
              iVar4 = curl_msnprintf((char *)left,sStack_1648,".%ld",pvStack_15d0);
              left = left + (long)iVar4;
            }
            if (((ulong)vto[param_num + -1].data.str & 0x2000000000) != 0) {
              *(undefined1 *)left = 0x6c;
              left = left + 1;
            }
            if (((ulong)vto[param_num + -1].data.str & 0x4000000000000) == 0) {
              if (((ulong)vto[param_num + -1].data.str & 0x8000000000000) == 0) {
                *(undefined1 *)left = 0x66;
              }
              else {
                uVar3 = 0x67;
                if (((ulong)vto[param_num + -1].data.str & 0x100000000000) != 0) {
                  uVar3 = 0x47;
                }
                *(undefined1 *)left = uVar3;
              }
            }
            else {
              uVar3 = 0x65;
              if (((ulong)vto[param_num + -1].data.str & 0x100000000000) != 0) {
                uVar3 = 0x45;
              }
              *(undefined1 *)left = uVar3;
            }
            left = left + 1;
            *(undefined1 *)left = 0;
            sprintf((char *)&p,(char *)&fptr,vto[param_num].precision);
            for (left = (size_t)&p; *(char *)left != '\0'; left = left + 1) {
              iVar4 = (*(code *)format_local)(*(undefined1 *)left,stream_local);
              if (iVar4 == -1) {
                return param._4_4_;
              }
              param._4_4_ = param._4_4_ + 1;
            }
          }
          p_Stack_40 = (__va_list_tag *)*stack0xffffffffffffeba0;
          unique0x10001cd3 = stack0xffffffffffffeba0 + 1;
        }
      }
      else {
        do {
          iVar4 = (*(code *)format_local)((char)p_Stack_40->gp_offset,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
          p_Var8 = (__va_list_tag *)((long)&p_Stack_40->gp_offset + 1);
          bVar9 = false;
          if (*(char *)((long)&p_Stack_40->gp_offset + 1) != '\0') {
            bVar9 = (char)p_Var8->gp_offset != '%';
          }
          p_Stack_40 = p_Var8;
        } while (bVar9);
      }
    }
    data_local._4_4_ = param._4_4_;
  }
  else {
    data_local._4_4_ = -1;
  }
  return data_local._4_4_;
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num = 0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (false?) warning Coverity gives us
     otherwise */
  char *workend = &work[sizeof(work) - 2];

  /* Do the actual %-code parsing */
  if(dprintf_Pass1(format, vto, endpos, ap_save))
    return -1;

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    unsigned long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    char *w;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param = dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM) {
      width = (long)vto[p->width].data.num.as_signed;
      param_num++; /* since the width is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        width = -width;
        p->flags |= FLAGS_LEFT;
        p->flags &= ~FLAGS_PAD_NIL;
      }
    }
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch(p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */

      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      while(num > 0) {
        *w-- = digits[num % base];
        num /= base;
      }
      width -= (long)(workend - w);
      prec -= (long)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
        --width;

      if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(p->flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(p->flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(p->flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(p->flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else
          len = strlen(str);

        width -= (len > LONG_MAX) ? LONG_MAX : (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        while((len-- > 0) && *str)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          if(width >= (long)sizeof(work))
            width = sizeof(work)-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* for each digit in the integer part, we can have one less
             precision */
          size_t maxprec = sizeof(work) - 2;
          double val = p->data.dnum;
          while(val >= 10.0) {
            val /= 10;
            maxprec--;
          }

          if(prec > (long)maxprec)
            prec = (long)maxprec-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
        (sprintf)(work, formatbuf, p->data.dnum);
        DEBUGASSERT(strlen(work) <= sizeof(work));
        for(fptr = work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}